

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psnr.c
# Opt level: O1

int64_t aom_highbd_get_u_sse(YV12_BUFFER_CONFIG *a,YV12_BUFFER_CONFIG *b)

{
  int64_t iVar1;
  
  iVar1 = highbd_get_sse((a->field_5).field_0.u_buffer,(a->field_4).field_0.uv_stride,
                         (b->field_5).field_0.u_buffer,(b->field_4).field_0.uv_stride,
                         (a->field_2).field_0.uv_crop_width,(a->field_3).field_0.uv_crop_height);
  return iVar1;
}

Assistant:

int64_t aom_highbd_get_u_sse(const YV12_BUFFER_CONFIG *a,
                             const YV12_BUFFER_CONFIG *b) {
  assert(a->uv_crop_width == b->uv_crop_width);
  assert(a->uv_crop_height == b->uv_crop_height);
  assert((a->flags & YV12_FLAG_HIGHBITDEPTH) != 0);
  assert((b->flags & YV12_FLAG_HIGHBITDEPTH) != 0);

  return highbd_get_sse(a->u_buffer, a->uv_stride, b->u_buffer, b->uv_stride,
                        a->uv_crop_width, a->uv_crop_height);
}